

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colMap.c
# Opt level: O1

int Col_MapSet(Col_Word map,Col_Word key,Col_Word value)

{
  int iVar1;
  code *UNRECOVERED_JUMPTABLE;
  uint uVar2;
  int iStack_c;
  
  if (map == 0) {
    uVar2 = 0;
  }
  else if ((map & 0xf) == 0) {
    uVar2 = -(uint)((*(byte *)map & 2) == 0) | *(byte *)map & 0xfffffffe;
  }
  else {
    uVar2 = immediateWordTypes[(uint)map & 0x1f];
  }
  UNRECOVERED_JUMPTABLE = Col_HashMapSet;
  if (uVar2 == 0xffffffff) {
    iVar1 = *(int *)(*(ulong *)map & 0xfffffffffffffffe);
    if (iVar1 == 0x800) {
      UNRECOVERED_JUMPTABLE = *(code **)((int *)(*(ulong *)map & 0xfffffffffffffffe) + 0xe);
    }
    else if (iVar1 == 0x4000) goto LAB_00111a06;
  }
  else if (uVar2 != 0x2a) {
    if (uVar2 != 0x42) {
      return 0;
    }
LAB_00111a06:
    UNRECOVERED_JUMPTABLE = Col_TrieMapSet;
    iStack_c = 1;
    if (map == 0) {
      uVar2 = 0;
    }
    else if ((map & 0xf) == 0) {
      uVar2 = *(byte *)map & 0xfffffffe;
      UNRECOVERED_JUMPTABLE = (code *)(ulong)uVar2;
      uVar2 = -(uint)((*(byte *)map & 2) == 0) | uVar2;
    }
    else {
      UNRECOVERED_JUMPTABLE = (code *)(ulong)((uint)map & 0x1f);
      uVar2 = immediateWordTypes[(long)UNRECOVERED_JUMPTABLE];
    }
    if (uVar2 == 0xffffffff) {
      UNRECOVERED_JUMPTABLE =
           (code *)TrieMapFindEntry(map,key,1,&iStack_c,(Col_Word *)0x0,(Col_Word *)0x0);
    }
    else if (uVar2 == 0x42) {
      UNRECOVERED_JUMPTABLE =
           (code *)StringTrieMapFindEntry(map,key,1,&iStack_c,(Col_Word *)0x0,(Col_Word *)0x0);
    }
    *(Col_Word *)(UNRECOVERED_JUMPTABLE + 0x18) = value;
    return iStack_c;
  }
  iVar1 = (*UNRECOVERED_JUMPTABLE)();
  return iVar1;
}

Assistant:

int
Col_MapSet(
    Col_Word map,   /*!< Map to insert entry into. */
    Col_Word key,   /*!< Entry key. Can be any word type, including string,
                         however it must match the actual type used by the
                         map. */
    Col_Word value) /*!< Entry value. */
{
    Col_MapSetProc *proc;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_WORDMAP,map} */
    TYPECHECK_WORDMAP(map) return 0;

    switch (WORD_TYPE(map)) {
    case WORD_TYPE_STRHASHMAP:
        proc = Col_HashMapSet;
        break;

    case WORD_TYPE_STRTRIEMAP:
        proc = Col_TrieMapSet;
        break;

    case WORD_TYPE_CUSTOM: {
        Col_CustomMapType *type = (Col_CustomMapType *) WORD_TYPEINFO(map);
        switch (type->type.type) {
        case COL_HASHMAP: proc = Col_HashMapSet; break;
        case COL_TRIEMAP: proc = Col_TrieMapSet; break;
        case COL_MAP:     proc = type->setProc; break;
        }
        break;
        }

    /* WORD_TYPE_UNKNOWN */

    default:
        /* CANTHAPPEN */
        ASSERT(0);
        return 0;
    }

    return proc(map, key, value);
}